

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction.cpp
# Opt level: O2

ByteData256 * __thiscall
cfd::core::Transaction::GetSignatureHash
          (ByteData256 *__return_storage_ptr__,Transaction *this,uint32_t txin_index,
          ByteData *script_data,SigHashType *sighash_type,Amount *value,WitnessVersion version)

{
  wally_tx *tx;
  bool bVar1;
  uint uVar2;
  uint32_t sighash;
  uint64_t satoshi;
  CfdException *pCVar3;
  uint32_t flags;
  int ret;
  allocator local_b1;
  wally_tx *tx_pointer;
  undefined1 local_a8 [32];
  ByteData256 *local_88;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buffer;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_60;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  
  local_88 = __return_storage_ptr__;
  bVar1 = ByteData::IsEmpty(script_data);
  if (bVar1) {
    local_a8._0_8_ = "cfdcore_transaction.cpp";
    local_a8._8_4_ = 0x2f2;
    local_a8._16_8_ = "GetSignatureHash";
    logger::warn<>((CfdSourceLocation *)local_a8,"empty script");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::__cxx11::string::string
              ((string *)local_a8,"Failed to GetSignatureHash. empty script.",(allocator *)&buffer);
    CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_a8);
    __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
  }
  if (version < kVersion1) {
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&buffer,0x20,(allocator_type *)local_a8);
    ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_48,
                       script_data);
    tx_pointer = (wally_tx *)0x0;
    ret = 0;
    uVar2 = (*(this->super_AbstractTransaction)._vptr_AbstractTransaction[7])(this);
    (*(this->super_AbstractTransaction)._vptr_AbstractTransaction[0xd])
              (local_a8,this,(ulong)(uVar2 & 0xff));
    ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_60,
                       (ByteData *)local_a8);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_a8);
    ret = wally_tx_from_bytes(local_60._M_impl.super__Vector_impl_data._M_start,
                              (long)local_60._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_60._M_impl.super__Vector_impl_data._M_start,0,&tx_pointer)
    ;
    if (ret != 0) {
      local_a8._0_8_ = "cfdcore_transaction.cpp";
      local_a8._8_4_ = 0x307;
      local_a8._16_8_ = "GetSignatureHash";
      logger::warn<int&>((CfdSourceLocation *)local_a8,"wally_tx_from_bytes NG[{}] ",&ret);
      pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::__cxx11::string::string((string *)local_a8,"transaction data invalid.",&local_b1);
      CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_a8);
      __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
    }
    ret = -3;
    if (tx_pointer != (wally_tx *)0x0) {
      if (version == kVersionNone) {
        flags = 0;
      }
      else {
        uVar2 = (*(this->super_AbstractTransaction)._vptr_AbstractTransaction[9])(this);
        flags = uVar2 & 1;
      }
      tx = tx_pointer;
      satoshi = Amount::GetSatoshiValue(value);
      sighash = SigHashType::GetSigHashFlag(sighash_type);
      ret = wally_tx_get_btc_signature_hash
                      (tx,(ulong)txin_index,local_48._M_impl.super__Vector_impl_data._M_start,
                       (long)local_48._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_48._M_impl.super__Vector_impl_data._M_start,satoshi,sighash,flags
                       ,buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                       (long)buffer.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)buffer.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start);
      wally_tx_free(tx_pointer);
      if (ret == 0) {
        ByteData256::ByteData256(local_88,&buffer);
        ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_60)
        ;
        ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_48)
        ;
        ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  (&buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
        return local_88;
      }
    }
    local_a8._0_8_ = "cfdcore_transaction.cpp";
    local_a8._8_4_ = 800;
    local_a8._16_8_ = "GetSignatureHash";
    logger::warn<int&>((CfdSourceLocation *)local_a8,"wally_tx_get_btc_signature_hash NG[{}] ",&ret)
    ;
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::__cxx11::string::string((string *)local_a8,"SignatureHash generate error.",&local_b1);
    CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_a8);
    __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
  }
  local_a8._0_8_ = "cfdcore_transaction.cpp";
  local_a8._8_4_ = 0x2f7;
  local_a8._16_8_ = "GetSignatureHash";
  logger::warn<>((CfdSourceLocation *)local_a8,"unsupport witness version on ECDSA.");
  pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string
            ((string *)local_a8,"unsupport witness version on ECDSA.",(allocator *)&buffer);
  CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_a8);
  __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

ByteData256 Transaction::GetSignatureHash(
    uint32_t txin_index, const ByteData &script_data, SigHashType sighash_type,
    const Amount &value, WitnessVersion version) const {
  if (script_data.IsEmpty()) {
    warn(CFD_LOG_SOURCE, "empty script");
    throw CfdException(
        kCfdIllegalArgumentError, "Failed to GetSignatureHash. empty script.");
  }
  if (version >= WitnessVersion::kVersion1) {
    warn(CFD_LOG_SOURCE, "unsupport witness version on ECDSA.");
    throw CfdException(
        kCfdIllegalArgumentError, "unsupport witness version on ECDSA.");
  }
  std::vector<uint8_t> buffer(SHA256_LEN);
  const std::vector<uint8_t> &bytes = script_data.GetBytes();
  struct wally_tx *tx_pointer = NULL;
  int ret = WALLY_OK;

  // It is assumed that tx information has been created.
  // (If it is not created, it will cause inconsistency)
  const std::vector<uint8_t> &tx_bytedata =
      GetByteData(HasWitness()).GetBytes();
  ret = wally_tx_from_bytes(
      tx_bytedata.data(), tx_bytedata.size(), 0, &tx_pointer);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_tx_from_bytes NG[{}] ", ret);
    throw CfdException(kCfdIllegalArgumentError, "transaction data invalid.");
  }

  ret = WALLY_ENOMEM;
  if (tx_pointer != NULL) {
    try {
      uint32_t tx_flag = 0;
      if (version != WitnessVersion::kVersionNone) {
        tx_flag = GetWallyFlag() & WALLY_TX_FLAG_USE_WITNESS;
      }
      ret = wally_tx_get_btc_signature_hash(
          tx_pointer, txin_index, bytes.data(), bytes.size(),
          value.GetSatoshiValue(), sighash_type.GetSigHashFlag(), tx_flag,
          buffer.data(), buffer.size());
      wally_tx_free(tx_pointer);
    } catch (...) {
      wally_tx_free(tx_pointer);  // Separately released in case of exception
                                  // (possibility of exception by warn ())
      warn(CFD_LOG_SOURCE, "wally_tx_get_btc_signature_hash cause exception.");
      ret = WALLY_ERROR;
    }
  }

  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_tx_get_btc_signature_hash NG[{}] ", ret);
    throw CfdException(
        kCfdIllegalArgumentError, "SignatureHash generate error.");
  }

  return ByteData256(buffer);
}